

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O0

void __thiscall ElideMiddleNothingToElide::Run(ElideMiddleNothingToElide *this)

{
  Test *pTVar1;
  __type _Var2;
  bool bVar3;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string input;
  ElideMiddleNothingToElide *this_local;
  
  input.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"Nothing to elide in this short string.",&local_31);
  std::allocator<char>::~allocator(&local_31);
  pTVar1 = g_current_test;
  ElideMiddle(&local_68,(string *)local_30,0x50);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,&local_68);
  testing::Test::Check
            (pTVar1,_Var2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x19d,"input == ElideMiddle(input, 80)");
  std::__cxx11::string::~string((string *)&local_68);
  pTVar1 = g_current_test;
  ElideMiddle(&local_88,(string *)local_30,0x26);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,&local_88);
  testing::Test::Check
            (pTVar1,_Var2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x19e,"input == ElideMiddle(input, 38)");
  std::__cxx11::string::~string((string *)&local_88);
  pTVar1 = g_current_test;
  ElideMiddle(&local_a8,(string *)local_30,0);
  bVar3 = std::operator==("",&local_a8);
  testing::Test::Check
            (pTVar1,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x19f,"\"\" == ElideMiddle(input, 0)");
  std::__cxx11::string::~string((string *)&local_a8);
  pTVar1 = g_current_test;
  ElideMiddle(&local_c8,(string *)local_30,1);
  bVar3 = std::operator==(".",&local_c8);
  testing::Test::Check
            (pTVar1,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x1a0,"\".\" == ElideMiddle(input, 1)");
  std::__cxx11::string::~string((string *)&local_c8);
  pTVar1 = g_current_test;
  ElideMiddle(&local_e8,(string *)local_30,2);
  bVar3 = std::operator==("..",&local_e8);
  testing::Test::Check
            (pTVar1,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x1a1,"\"..\" == ElideMiddle(input, 2)");
  std::__cxx11::string::~string((string *)&local_e8);
  pTVar1 = g_current_test;
  ElideMiddle(&local_108,(string *)local_30,3);
  bVar3 = std::operator==("...",&local_108);
  testing::Test::Check
            (pTVar1,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x1a2,"\"...\" == ElideMiddle(input, 3)");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ElideMiddle, NothingToElide) {
  string input = "Nothing to elide in this short string.";
  EXPECT_EQ(input, ElideMiddle(input, 80));
  EXPECT_EQ(input, ElideMiddle(input, 38));
  EXPECT_EQ("", ElideMiddle(input, 0));
  EXPECT_EQ(".", ElideMiddle(input, 1));
  EXPECT_EQ("..", ElideMiddle(input, 2));
  EXPECT_EQ("...", ElideMiddle(input, 3));
}